

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O2

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  bool bVar1;
  bool bVar2;
  undefined8 *in_RDX;
  VersionEdit *pVVar3;
  char *__s;
  int level;
  uint32_t tag;
  Status *result;
  uint64_t number;
  Slice str;
  InternalKey key;
  Slice input;
  FileMetaData f;
  int local_190;
  uint32_t local_18c;
  VersionEdit *local_188;
  Slice *local_180;
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
  *local_178;
  Slice *local_170;
  Slice *local_168;
  size_t *local_160;
  Slice *local_158;
  size_t *local_150;
  _Alloc_hider local_148;
  pointer local_140;
  Slice local_138;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  InternalKey local_c8;
  Slice local_a8;
  FileMetaData local_98;
  Slice local_40;
  
  local_188 = this;
  Clear((VersionEdit *)src);
  local_a8.data_ = (char *)*in_RDX;
  local_a8.size_ = in_RDX[1];
  local_98.refs = 0;
  local_98.allowed_seeks = 0x40000000;
  local_98.file_size = 0;
  local_98.smallest.rep_._M_dataplus._M_p = (pointer)&local_98.smallest.rep_.field_2;
  local_98.smallest.rep_._M_string_length = 0;
  __s = (char *)0x0;
  local_98.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_98.largest.rep_._M_dataplus._M_p = (pointer)&local_98.largest.rep_.field_2;
  local_98.largest.rep_._M_string_length = 0;
  local_98.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_138.data_ = "";
  local_138.size_ = 0;
  local_c8.rep_._M_dataplus._M_p = (pointer)&local_c8.rep_.field_2;
  local_c8.rep_._M_string_length = 0;
  local_c8.rep_.field_2._M_local_buf[0] = '\0';
  local_180 = src + 9;
  local_170 = src + 6;
  local_178 = (vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
               *)&src[4].size_;
  local_150 = &src[3].size_;
  local_158 = src + 3;
  local_160 = &src[2].size_;
  local_168 = src + 2;
  bVar1 = true;
switchD_00115d5d_caseD_8:
  if (!bVar1) {
LAB_00116012:
    pVVar3 = local_188;
    (local_188->comparator_)._M_dataplus._M_p = (pointer)0x0;
    local_128 = (undefined1  [8])0x1287b9;
    local_120._M_p = (pointer)0xb;
    local_40.data_ = __s;
    local_40.size_ = strlen(__s);
    Status::Corruption((Status *)&local_148,(Slice *)local_128,&local_40);
    (pVVar3->comparator_)._M_dataplus._M_p = local_148._M_p;
    local_148._M_p = (pointer)0x0;
    Status::~Status((Status *)&local_148);
LAB_0011606a:
    std::__cxx11::string::~string((string *)&local_c8);
    FileMetaData::~FileMetaData(&local_98);
    return (Status)(char *)pVVar3;
  }
  bVar1 = GetVarint32(&local_a8,&local_18c);
  if (!bVar1) {
    if (local_a8.size_ == 0) {
      (local_188->comparator_)._M_dataplus._M_p = (pointer)0x0;
      pVVar3 = local_188;
      goto LAB_0011606a;
    }
    __s = "invalid tag";
    goto LAB_00116012;
  }
  bVar1 = false;
  __s = "unknown tag";
  switch(local_18c) {
  case 1:
    bVar2 = GetLengthPrefixedSlice(&local_a8,&local_138);
    bVar1 = false;
    __s = "comparator name";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    Slice::ToString_abi_cxx11_((string *)local_128,&local_138);
    std::__cxx11::string::operator=((string *)src,(string *)local_128);
    std::__cxx11::string::~string((string *)local_128);
    *(undefined1 *)&src[4].data_ = 1;
    break;
  case 2:
    bVar2 = GetVarint64(&local_a8,(uint64_t *)local_168);
    bVar1 = false;
    __s = "log number";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 1) = 1;
    break;
  case 3:
    bVar2 = GetVarint64(&local_a8,(uint64_t *)local_158);
    bVar1 = false;
    __s = "next file number";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 3) = 1;
    break;
  case 4:
    bVar2 = GetVarint64(&local_a8,local_150);
    bVar1 = false;
    __s = "last sequence number";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 4) = 1;
    break;
  case 5:
    bVar2 = GetLevel(&local_a8,&local_190);
    bVar1 = false;
    __s = "compaction pointer";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    bVar2 = GetInternalKey(&local_a8,&local_c8);
    bVar1 = false;
    __s = "compaction pointer";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    local_128._0_4_ = local_190;
    std::__cxx11::string::string((string *)&local_120,(string *)&local_c8);
    std::
    vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
    ::emplace_back<std::pair<int,leveldb::InternalKey>>
              (local_178,(pair<int,_leveldb::InternalKey> *)local_128);
    std::__cxx11::string::~string((string *)&local_120);
    break;
  case 6:
    bVar2 = GetLevel(&local_a8,&local_190);
    bVar1 = false;
    __s = "deleted file";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    bVar2 = GetVarint64(&local_a8,(uint64_t *)&local_140);
    bVar1 = false;
    __s = "deleted file";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    local_128._0_4_ = local_190;
    local_120._M_p = local_140;
    std::
    _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
    ::_M_insert_unique<std::pair<int,unsigned_long>>
              ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                *)local_170,(pair<int,_unsigned_long> *)local_128);
    break;
  case 7:
    bVar2 = GetLevel(&local_a8,&local_190);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    bVar2 = GetVarint64(&local_a8,&local_98.number);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    bVar2 = GetVarint64(&local_a8,&local_98.file_size);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    bVar2 = GetInternalKey(&local_a8,&local_98.smallest);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    bVar2 = GetInternalKey(&local_a8,&local_98.largest);
    bVar1 = false;
    __s = "new-file entry";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    local_128._0_4_ = local_190;
    FileMetaData::FileMetaData((FileMetaData *)&local_120,&local_98);
    std::
    vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
    ::emplace_back<std::pair<int,leveldb::FileMetaData>>
              ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                *)local_180,(pair<int,_leveldb::FileMetaData> *)local_128);
    FileMetaData::~FileMetaData((FileMetaData *)&local_120);
    break;
  default:
    goto switchD_00115d5d_caseD_8;
  case 9:
    bVar2 = GetVarint64(&local_a8,local_160);
    bVar1 = false;
    __s = "previous log number";
    if (!bVar2) goto switchD_00115d5d_caseD_8;
    *(undefined1 *)((long)&src[4].data_ + 2) = 1;
  }
  bVar1 = true;
  __s = (char *)0x0;
  goto switchD_00115d5d_caseD_8;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}